

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O1

int secp256k1_ecdsa_sign
              (secp256k1_context *ctx,secp256k1_ecdsa_signature *signature,uchar *msghash32,
              uchar *seckey,secp256k1_nonce_function noncefp,void *noncedata)

{
  secp256k1_scalar *r_00;
  secp256k1_scalar sVar1;
  int iVar2;
  uint uVar3;
  bool bVar4;
  int ret;
  secp256k1_scalar s;
  secp256k1_scalar r;
  secp256k1_scalar msg;
  secp256k1_scalar non;
  secp256k1_scalar sec;
  int is_nonce_valid;
  int vflag;
  secp256k1_scalar n;
  unsigned_long _zzq_result;
  unsigned_long _zzq_args [6];
  uchar nonce32 [32];
  uchar b [32];
  secp256k1_scalar local_220;
  secp256k1_scalar local_21c;
  secp256k1_scalar local_218 [3];
  secp256k1_scalar local_20c [4];
  secp256k1_scalar local_1fc;
  undefined8 local_1f8;
  secp256k1_ge *local_1f0;
  undefined8 local_1e8;
  undefined8 local_1e0;
  undefined8 local_1d8;
  undefined8 local_1d0;
  uchar *local_1c0;
  uint local_1b8;
  uint local_1b4;
  int local_1b0 [2];
  secp256k1_ge local_1a8;
  secp256k1_ecdsa_signature *local_140;
  secp256k1_context *local_138;
  void *local_130;
  secp256k1_nonce_function local_128;
  uchar *local_120;
  secp256k1_gej local_118;
  uchar local_78 [72];
  
  local_1c0 = msghash32;
  if (ctx == (secp256k1_context *)0x0) {
    secp256k1_ecdsa_sign_cold_5();
  }
  else if ((ctx->ecmult_gen_ctx).built != 0) {
    if (msghash32 == (uchar *)0x0) {
      secp256k1_ecdsa_sign_cold_3();
      return 0;
    }
    if (signature == (secp256k1_ecdsa_signature *)0x0) {
      secp256k1_ecdsa_sign_cold_2();
      return 0;
    }
    if (seckey == (uchar *)0x0) {
      secp256k1_ecdsa_sign_cold_1();
      return 0;
    }
    local_220 = 0;
    local_218[0] = 0;
    local_21c = 0;
    local_128 = nonce_function_rfc6979;
    if (noncefp != (secp256k1_nonce_function)0x0) {
      local_128 = noncefp;
    }
    local_140 = signature;
    local_120 = seckey;
    local_1b8 = secp256k1_scalar_set_b32_seckey(local_20c,seckey);
    local_1f8 = CONCAT44(local_1f8._4_4_,local_1b8) ^ 1;
    secp256k1_scalar_verify(&secp256k1_scalar_one);
    local_118.x.n[0] = 0x4d430005;
    local_118.x.n[2] = 4;
    local_118.x.n[3] = 0;
    local_118.x.n[4] = 0;
    local_118.x.magnitude = 0;
    local_118.x.normalized = 0;
    local_1a8.x.n[0] = 0;
    local_20c[0] = (uint)local_1f8 & 1 | (uint)local_1f8 - 1 & local_20c[0];
    local_118.x.n[1] = (uint64_t)local_20c;
    secp256k1_scalar_verify(local_20c);
    secp256k1_scalar_set_b32(local_218 + 1,local_1c0,(int *)0x0);
    uVar3 = 0;
    local_138 = ctx;
    local_130 = noncedata;
    do {
      bVar4 = false;
      iVar2 = (*local_128)(local_78,local_1c0,local_120,(uchar *)0x0,noncedata,uVar3);
      local_220 = (secp256k1_scalar)(iVar2 != 0);
      if (iVar2 != 0) {
        local_1fc = secp256k1_scalar_set_b32_seckey(local_218 + 2,local_78);
        if (ctx->declassify != 0) {
          local_118.x.n[0] = 0x4d430002;
          local_118.x.n[1] = (uint64_t)&local_1fc;
          local_118.x.n[2] = 4;
          local_118.x.n[3] = 0;
          local_118.x.n[4] = 0;
          local_118.x.magnitude = 0;
          local_118.x.normalized = 0;
          local_1a8.x.n[0] = 0;
        }
        if (local_1fc != 0) {
          local_1b0[0] = 0;
          local_1b4 = uVar3;
          secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx,&local_118,local_218 + 2);
          secp256k1_ge_set_gej(&local_1a8,&local_118);
          secp256k1_fe_normalize(&local_1a8.x);
          secp256k1_fe_normalize(&local_1a8.y);
          secp256k1_fe_get_b32(local_78 + 0x20,&local_1a8.x);
          secp256k1_scalar_set_b32(local_218,local_78 + 0x20,local_1b0);
          r_00 = (secp256k1_scalar *)(local_1b0 + 1);
          secp256k1_scalar_mul(r_00,local_218,local_20c);
          secp256k1_scalar_add(r_00,r_00,local_218 + 1);
          secp256k1_scalar_inverse(&local_21c,local_218 + 2);
          secp256k1_scalar_mul(&local_21c,&local_21c,r_00);
          local_1b0[1] = 0;
          local_1f8 = 0x4d430001;
          local_1e8 = 4;
          local_1e0 = 0;
          local_1d8 = 0;
          local_1d0 = 0;
          local_20c[1] = 0;
          local_20c[2] = 0;
          local_1f0 = (secp256k1_ge *)r_00;
          memset(&local_118,0,0x98);
          local_1a8.x.n[0] = 0;
          local_1a8.x.n[1] = 0;
          local_1a8.x.n[2] = 0;
          local_1a8.x.n[3] = 0;
          local_1a8.x.n[4] = 0;
          local_1a8.x.magnitude = 0;
          local_1a8.x.normalized = 0;
          local_1a8.y.n[0] = 0;
          local_1a8.y.n[1] = 0;
          local_1a8.y.n[2] = 0;
          local_1a8.y.n[3] = 0;
          local_1a8.y.n[4] = 0;
          local_1a8.y.magnitude = 0;
          local_1a8.y.normalized = 0;
          local_1a8.infinity = 0;
          local_1a8._100_4_ = 0;
          local_1f8 = 0x4d430001;
          local_1e8 = 0x68;
          local_1e0 = 0;
          local_1d8 = 0;
          local_1d0 = 0;
          local_20c[1] = 0;
          local_20c[2] = 0;
          local_1f0 = &local_1a8;
          secp256k1_scalar_verify(&local_21c);
          sVar1 = local_21c;
          secp256k1_scalar_verify(&local_21c);
          if (6 < sVar1) {
            secp256k1_scalar_verify(&local_21c);
            uVar3 = 0xd - local_21c;
            if (local_21c == 0) {
              uVar3 = 0;
            }
            local_21c = uVar3;
            secp256k1_scalar_verify(&local_21c);
          }
          secp256k1_scalar_verify(&local_21c);
          secp256k1_scalar_verify(local_218);
          bVar4 = local_218[0] != 0;
          secp256k1_scalar_verify(&local_21c);
          local_220 = (secp256k1_scalar)(local_21c != 0 && bVar4);
          if (local_138->declassify != 0) {
            local_118.x.n[0] = 0x4d430002;
            local_118.x.n[1] = (uint64_t)&local_220;
            local_118.x.n[2] = 4;
            local_118.x.n[3] = 0;
            local_118.x.n[4] = 0;
            local_118.x.magnitude = 0;
            local_118.x.normalized = 0;
            local_1a8.x.n[0] = 0;
          }
          noncedata = local_130;
          ctx = local_138;
          uVar3 = local_1b4;
          if (local_220 != 0) {
            bVar4 = false;
            goto LAB_00109060;
          }
        }
        uVar3 = uVar3 + 1;
        bVar4 = true;
      }
LAB_00109060:
      if (!bVar4) {
        local_220 = local_220 & local_1b8;
        local_78[0] = '\0';
        local_78[1] = '\0';
        local_78[2] = '\0';
        local_78[3] = '\0';
        local_78[4] = '\0';
        local_78[5] = '\0';
        local_78[6] = '\0';
        local_78[7] = '\0';
        local_78[8] = '\0';
        local_78[9] = '\0';
        local_78[10] = '\0';
        local_78[0xb] = '\0';
        local_78[0xc] = '\0';
        local_78[0xd] = '\0';
        local_78[0xe] = '\0';
        local_78[0xf] = '\0';
        local_78[0x10] = '\0';
        local_78[0x11] = '\0';
        local_78[0x12] = '\0';
        local_78[0x13] = '\0';
        local_78[0x14] = '\0';
        local_78[0x15] = '\0';
        local_78[0x16] = '\0';
        local_78[0x17] = '\0';
        local_78[0x18] = '\0';
        local_78[0x19] = '\0';
        local_78[0x1a] = '\0';
        local_78[0x1b] = '\0';
        local_78[0x1c] = '\0';
        local_78[0x1d] = '\0';
        local_78[0x1e] = '\0';
        local_78[0x1f] = '\0';
        local_218[1] = 0;
        local_218[2] = 0;
        local_20c[0] = 0;
        local_118.x.n[1] = (uint64_t)local_20c;
        local_118.x.n[0] = 0x4d430001;
        local_118.x.n[2] = 4;
        local_118.x.n[3] = 0;
        local_118.x.n[4] = 0;
        local_118.x.magnitude = 0;
        local_118.x.normalized = 0;
        local_1a8.x.n[0] = 0;
        local_1f8._0_4_ = (uint)(local_220 == 0);
        secp256k1_scalar_verify(&secp256k1_scalar_zero);
        local_118.x.n[0] = 0x4d430005;
        local_118.x.n[2] = 4;
        local_118.x.n[3] = 0;
        local_118.x.n[4] = 0;
        local_118.x.magnitude = 0;
        local_118.x.normalized = 0;
        local_1a8.x.n[0] = 0;
        local_218[0] = local_218[0] & (uint)local_1f8 - 1;
        local_118.x.n[1] = (uint64_t)local_218;
        secp256k1_scalar_verify(local_218);
        local_1f8 = CONCAT44(local_1f8._4_4_,(uint)(local_220 == 0));
        secp256k1_scalar_verify(&secp256k1_scalar_zero);
        local_118.x.n[0] = 0x4d430005;
        local_118.x.n[2] = 4;
        local_118.x.n[3] = 0;
        local_118.x.n[4] = 0;
        local_118.x.magnitude = 0;
        local_118.x.normalized = 0;
        local_1a8.x.n[0] = 0;
        local_21c = local_21c & (uint)local_1f8 - 1;
        local_118.x.n[1] = (uint64_t)&local_21c;
        secp256k1_scalar_verify(&local_21c);
        sVar1 = local_220;
        secp256k1_ecdsa_signature_save(local_140,local_218,&local_21c);
        return sVar1;
      }
    } while( true );
  }
  secp256k1_ecdsa_sign_cold_4();
  return 0;
}

Assistant:

int secp256k1_ecdsa_sign(const secp256k1_context* ctx, secp256k1_ecdsa_signature *signature, const unsigned char *msghash32, const unsigned char *seckey, secp256k1_nonce_function noncefp, const void* noncedata) {
    secp256k1_scalar r, s;
    int ret;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(msghash32 != NULL);
    ARG_CHECK(signature != NULL);
    ARG_CHECK(seckey != NULL);

    ret = secp256k1_ecdsa_sign_inner(ctx, &r, &s, NULL, msghash32, seckey, noncefp, noncedata);
    secp256k1_ecdsa_signature_save(signature, &r, &s);
    return ret;
}